

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitClassInitializers
               (ParseNode *memberList,RegSlot objectLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo,ParseNode *parentNode,bool isObjectEmpty)

{
  ParseNodeBin *pPVar1;
  ParseNode *memberNode;
  ParseNode *pPStack_30;
  bool isObjectEmpty_local;
  ParseNode *parentNode_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodePtr pPStack_10;
  RegSlot objectLocation_local;
  ParseNode *memberList_local;
  
  memberNode._7_1_ = isObjectEmpty;
  pPStack_30 = parentNode;
  parentNode_local = (ParseNode *)funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local._4_4_ = objectLocation;
  pPStack_10 = memberList;
  if (memberList != (ParseNode *)0x0) {
    while (pPStack_10->nop == knopList) {
      pPVar1 = ParseNode::AsParseNodeBin(pPStack_10);
      EmitMemberNode(pPVar1->pnode1,byteCodeGenerator_local._4_4_,
                     (ByteCodeGenerator *)funcInfo_local,(FuncInfo *)parentNode_local,pPStack_30,
                     false,(bool *)((long)&memberNode + 7));
      pPVar1 = ParseNode::AsParseNodeBin(pPStack_10);
      pPStack_10 = pPVar1->pnode2;
    }
    EmitMemberNode(pPStack_10,byteCodeGenerator_local._4_4_,(ByteCodeGenerator *)funcInfo_local,
                   (FuncInfo *)parentNode_local,pPStack_30,false,(bool *)((long)&memberNode + 7));
  }
  return;
}

Assistant:

void EmitClassInitializers(ParseNode *memberList, Js::RegSlot objectLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, ParseNode* parentNode, bool isObjectEmpty)
{
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            ParseNode *memberNode = memberList->AsParseNodeBin()->pnode1;
            EmitMemberNode(memberNode, objectLocation, byteCodeGenerator, funcInfo, parentNode, /*useStore*/ false, &isObjectEmpty);
            memberList = memberList->AsParseNodeBin()->pnode2;
        }
        EmitMemberNode(memberList, objectLocation, byteCodeGenerator, funcInfo, parentNode, /*useStore*/ false, &isObjectEmpty);
    }
}